

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O3

string * __thiscall
font2svg::glyph::svgtransform_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  undefined1 *this_00;
  FT_Pos FVar1;
  FT_Pos FVar2;
  ostream *poVar3;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  this_00 = &this->field_0x270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\n\n <!-- make sure glyph is visible within svg window -->",0x38);
  FVar1 = (this->gm).horiBearingY;
  FVar2 = (this->gm).vertBearingY;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\n <g fill-rule=\'nonzero\' ",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," transform=\'translate(",0x16);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)this_00,100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)FVar2 + (int)FVar1 + 100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\'",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgtransform() {
		// TrueType points are not in the range usually visible by SVG.
		// they often have negative numbers etc. So.. here we
		// 'transform' to make visible.
		//
		// note also that y coords of all points have been flipped during
		// init() so that SVG Y positive = Truetype Y positive
		tmp.str("");
		tmp << "\n\n <!-- make sure glyph is visible within svg window -->";
		int yadj = gm.horiBearingY + gm.vertBearingY + 100;
		int xadj = 100;
		tmp << "\n <g fill-rule='nonzero' "
			<< " transform='translate(" << xadj << " " << yadj << ")'"
			<< ">";
		return tmp.str();
	}